

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

vector4 * vector4_subtractf(vector4 *self,float f)

{
  float f_local;
  vector4 *self_local;
  
  (self->field_0).v[0] = (self->field_0).v[0] - f;
  (self->field_0).v[1] = (self->field_0).v[1] - f;
  (self->field_0).v[2] = (self->field_0).v[2] - f;
  (self->field_0).v[3] = (self->field_0).v[3] - f;
  return self;
}

Assistant:

HYPAPI struct vector4 *vector4_subtractf(struct vector4 *self, HYP_FLOAT f)
{
	self->x -= f;
	self->y -= f;
	self->z -= f;
	self->w -= f;
	return self;
}